

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

QRect __thiscall QPlainTextEdit::cursorRect(QPlainTextEdit *this,QTextCursor *cursor)

{
  QPlainTextEditPrivate *this_00;
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  qreal qVar5;
  QRect QVar6;
  QRectF QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  cVar1 = QTextCursor::isNull();
  if (cVar1 == '\0') {
    QPlainTextEditControl::cursorRect(&QStack_58,this_00->control,cursor);
    QVar6 = QRectF::toRect(&QStack_58);
    iVar2 = QPlainTextEditPrivate::horizontalOffset(this_00);
    qVar5 = QPlainTextEditPrivate::verticalOffset(this_00);
    uVar4 = CONCAT44(QVar6.y1.m_i.m_i - (int)qVar5,QVar6.x1.m_i.m_i - iVar2);
    uVar3 = CONCAT44(QVar6.y2.m_i.m_i - (int)qVar5,QVar6.x2.m_i.m_i - iVar2);
  }
  else {
    uVar3 = 0xffffffffffffffff;
    uVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar6.x2.m_i = (int)uVar3;
    QVar6.y2.m_i = (int)((ulong)uVar3 >> 0x20);
    QVar6.x1.m_i = (int)uVar4;
    QVar6.y1.m_i = (int)((ulong)uVar4 >> 0x20);
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPlainTextEdit::cursorRect(const QTextCursor &cursor) const
{
    Q_D(const QPlainTextEdit);
    if (cursor.isNull())
        return QRect();

    QRect r = d->control->cursorRect(cursor).toRect();
    r.translate(-d->horizontalOffset(),-(int)d->verticalOffset());
    return r;
}